

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O1

void fs_event_cb_dir_multi_file(uv_fs_event_t *handle,char *filename,int events,int status)

{
  int iVar1;
  uv_loop_t *loop;
  int iVar2;
  int extraout_EDX;
  uint uVar3;
  char *pcVar4;
  uv_fs_t *puVar5;
  uv_fs_event_t *puVar6;
  uv_timer_t *loop_00;
  uv_fs_event_t *puVar7;
  uv_fs_t uStack_1f0;
  uv_loop_t *puStack_38;
  code *pcStack_30;
  char *pcStack_28;
  
  uVar3 = fs_event_cb_called + 1;
  pcVar4 = (char *)(ulong)uVar3;
  fs_event_cb_called = uVar3;
  if (handle == &fs_event) {
    if (status != 0) goto LAB_0014e119;
    if (1 < events - 1U) goto LAB_0014e11e;
    iVar1 = strncmp(filename,"fsevent-",8);
    if (iVar1 == 0) {
      if (fs_event_removed + fs_event_created == 0x10) {
        iVar1 = uv_timer_start(&timer,fs_event_unlink_files,1,0);
        if (iVar1 == 0) {
          return;
        }
        fs_event_cb_dir_multi_file_cold_5();
      }
      if (uVar3 != 0x20) {
        return;
      }
      uv_close((uv_handle_t *)&timer,close_cb);
      uv_close((uv_handle_t *)&fs_event,close_cb);
      return;
    }
  }
  else {
    fs_event_cb_dir_multi_file_cold_1();
LAB_0014e119:
    fs_event_cb_dir_multi_file_cold_2();
LAB_0014e11e:
    fs_event_cb_dir_multi_file_cold_3();
  }
  fs_event_cb_dir_multi_file_cold_4();
  if (fs_event_created < 0x10) {
    pcVar4 = fs_event_filename;
    snprintf(fs_event_filename,0x1000,"watch_dir/%s%d","fsevent-");
    create_file(fs_event_filename);
    if (0xe < fs_event_created) {
      fs_event_created = fs_event_created + 1;
      return;
    }
    fs_event_created = fs_event_created + 1;
    iVar1 = uv_timer_start(&timer,fs_event_create_files,1,0);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    fs_event_create_files_cold_1();
  }
  fs_event_create_files_cold_2();
  pcStack_30 = (code *)0x14e1aa;
  pcStack_28 = pcVar4;
  loop = uv_default_loop();
  pcStack_30 = (code *)0x14e1bc;
  remove("watch_dir/file2");
  pcStack_30 = (code *)0x14e1cb;
  remove("watch_dir/file1");
  pcStack_30 = (code *)0x14e1d7;
  remove("watch_dir/");
  pcStack_30 = (code *)0x14e1e3;
  create_dir("watch_dir");
  pcStack_30 = (code *)0x14e1eb;
  create_file("watch_dir/file1");
  pcStack_30 = (code *)0x14e1f3;
  create_file("watch_dir/file2");
  pcStack_30 = (code *)0x14e202;
  loop_00 = (uv_timer_t *)loop;
  iVar1 = uv_fs_event_init(loop,&fs_event);
  if (iVar1 == 0) {
    puVar6 = &fs_event;
    pcStack_30 = (code *)0x14e226;
    iVar1 = uv_fs_event_start(&fs_event,fs_event_cb_file,"watch_dir/file2",0);
    loop_00 = (uv_timer_t *)puVar6;
    if (iVar1 != 0) goto LAB_0014e2fc;
    pcStack_30 = (code *)0x14e23d;
    loop_00 = (uv_timer_t *)loop;
    iVar1 = uv_timer_init(loop,&timer);
    if (iVar1 != 0) goto LAB_0014e301;
    loop_00 = &timer;
    pcStack_30 = (code *)0x14e262;
    iVar1 = uv_timer_start(&timer,timer_cb_file,100,100);
    if (iVar1 != 0) goto LAB_0014e306;
    pcStack_30 = (code *)0x14e274;
    loop_00 = (uv_timer_t *)loop;
    uv_run(loop,UV_RUN_DEFAULT);
    if (fs_event_cb_called != 1) goto LAB_0014e30b;
    if (timer_cb_called != 2) goto LAB_0014e310;
    if (close_cb_called != 2) goto LAB_0014e315;
    pcStack_30 = (code *)0x14e2a3;
    remove("watch_dir/file2");
    pcStack_30 = (code *)0x14e2af;
    remove("watch_dir/file1");
    pcStack_30 = (code *)0x14e2bb;
    remove("watch_dir/");
    pcStack_30 = (code *)0x14e2c0;
    loop = uv_default_loop();
    pcStack_30 = (code *)0x14e2d4;
    uv_walk(loop,close_walk_cb,(void *)0x0);
    pcStack_30 = (code *)0x14e2de;
    uv_run(loop,UV_RUN_DEFAULT);
    pcStack_30 = (code *)0x14e2e3;
    loop_00 = (uv_timer_t *)uv_default_loop();
    pcStack_30 = (code *)0x14e2eb;
    iVar1 = uv_loop_close((uv_loop_t *)loop_00);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    pcStack_30 = (code *)0x14e2fc;
    run_test_fs_event_watch_file_cold_1();
LAB_0014e2fc:
    pcStack_30 = (code *)0x14e301;
    run_test_fs_event_watch_file_cold_2();
LAB_0014e301:
    pcStack_30 = (code *)0x14e306;
    run_test_fs_event_watch_file_cold_3();
LAB_0014e306:
    pcStack_30 = (code *)0x14e30b;
    run_test_fs_event_watch_file_cold_4();
LAB_0014e30b:
    pcStack_30 = (code *)0x14e310;
    run_test_fs_event_watch_file_cold_5();
LAB_0014e310:
    pcStack_30 = (code *)0x14e315;
    run_test_fs_event_watch_file_cold_6();
LAB_0014e315:
    pcStack_30 = (code *)0x14e31a;
    run_test_fs_event_watch_file_cold_7();
  }
  pcStack_30 = create_file;
  run_test_fs_event_watch_file_cold_8();
  pcStack_30 = (code *)0x192f1e;
  puVar6 = (uv_fs_event_t *)&uStack_1f0;
  puVar5 = &uStack_1f0;
  puVar7 = (uv_fs_event_t *)0x0;
  iVar2 = 0x41;
  puStack_38 = loop;
  iVar1 = uv_fs_open((uv_loop_t *)0x0,&uStack_1f0,(char *)loop_00,0x41,0x180,(uv_fs_cb)0x0);
  if (iVar1 < 0) {
    create_file_cold_1();
  }
  else {
    uv_fs_req_cleanup(&uStack_1f0);
    puVar7 = (uv_fs_event_t *)0x0;
    iVar2 = 0;
    iVar1 = uv_fs_close((uv_loop_t *)0x0,&uStack_1f0,iVar1,(uv_fs_cb)0x0);
    puVar6 = (uv_fs_event_t *)puVar5;
    if (iVar1 == 0) {
      uv_fs_req_cleanup(&uStack_1f0);
      return;
    }
  }
  create_file_cold_2();
  fs_event_cb_called = fs_event_cb_called + 1;
  if (puVar7 == &fs_event) {
    if (iVar2 != 0) goto LAB_0014e3df;
    if (extraout_EDX != 2) goto LAB_0014e3e4;
    iVar1 = strcmp((char *)puVar6,"file2");
    if (iVar1 == 0) {
      puVar6 = &fs_event;
      iVar1 = uv_fs_event_stop(&fs_event);
      if (iVar1 == 0) {
        uv_close((uv_handle_t *)&fs_event,close_cb);
        return;
      }
      goto LAB_0014e3ee;
    }
  }
  else {
    fs_event_cb_file_cold_1();
LAB_0014e3df:
    fs_event_cb_file_cold_2();
LAB_0014e3e4:
    puVar6 = puVar7;
    fs_event_cb_file_cold_3();
  }
  fs_event_cb_file_cold_4();
LAB_0014e3ee:
  fs_event_cb_file_cold_5();
  if (timer_cb_called == 0) {
    timer_cb_called = timer_cb_called + 1;
    touch_file("watch_dir/file1");
    return;
  }
  timer_cb_called = timer_cb_called + 1;
  touch_file("watch_dir/file2");
  uv_close((uv_handle_t *)puVar6,close_cb);
  return;
}

Assistant:

static void fs_event_cb_dir_multi_file(uv_fs_event_t* handle,
                                       const char* filename,
                                       int events,
                                       int status) {
  fs_event_cb_called++;
  ASSERT(handle == &fs_event);
  ASSERT(status == 0);
  ASSERT(events == UV_CHANGE || events == UV_RENAME);
  #if defined(__APPLE__) || defined(_WIN32) || defined(__linux__)
  ASSERT(strncmp(filename, file_prefix, sizeof(file_prefix) - 1) == 0);
  #else
  ASSERT(filename == NULL ||
         strncmp(filename, file_prefix, sizeof(file_prefix) - 1) == 0);
  #endif

  if (fs_event_created + fs_event_removed == fs_event_file_count) {
    /* Once we've processed all create events, delete all files */
    ASSERT(0 == uv_timer_start(&timer, fs_event_unlink_files, 1, 0));
  } else if (fs_event_cb_called == 2 * fs_event_file_count) {
    /* Once we've processed all create and delete events, stop watching */
    uv_close((uv_handle_t*) &timer, close_cb);
    uv_close((uv_handle_t*) handle, close_cb);
  }
}